

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixF0Contour
               (double **f0_candidates,double **f0_scores,int f0_length,int number_of_candidates,
               double allowed_range,double *best_f0_contour)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *base_f0_contour;
  double *f0_step1;
  int in_ECX;
  int in_EDX;
  double **in_RSI;
  double **in_RDI;
  double *in_XMM0_Qa;
  double *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  double *tmp_f0_contour2;
  double *tmp_f0_contour1;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  base_f0_contour = (double *)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_EDX;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  f0_step1 = (double *)operator_new__(uVar3);
  SearchF0Base(in_RDI,in_RSI,in_EDX,in_ECX,base_f0_contour);
  FixStep1(base_f0_contour,in_EDX,0.008,f0_step1);
  FixStep2((double *)in_RSI,in_EDX,in_ECX,in_XMM0_Qa);
  FixStep3((double *)f0_candidates,f0_scores._4_4_,(int)f0_scores,
           (double **)CONCAT44(f0_length,number_of_candidates),allowed_range,
           (double **)best_f0_contour,tmp_f0_contour1);
  FixStep4(tmp_f0_contour2,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  if (base_f0_contour != (double *)0x0) {
    operator_delete__(base_f0_contour);
  }
  if (f0_step1 != (double *)0x0) {
    operator_delete__(f0_step1);
  }
  return;
}

Assistant:

static void FixF0Contour(const double * const *f0_candidates,
    const double * const *f0_scores, int f0_length, int number_of_candidates,
#if 0
    double *best_f0_contour) {
#else
    double allowed_range, double *best_f0_contour) {
#endif
  double *tmp_f0_contour1 = new double[f0_length];
  double *tmp_f0_contour2 = new double[f0_length];

  // These parameters are optimized by speech databases.
  SearchF0Base(f0_candidates, f0_scores, f0_length,
      number_of_candidates, tmp_f0_contour1);
  FixStep1(tmp_f0_contour1, f0_length, 0.008, tmp_f0_contour2);
  FixStep2(tmp_f0_contour2, f0_length, 6, tmp_f0_contour1);
  FixStep3(tmp_f0_contour1, f0_length, number_of_candidates, f0_candidates,
#if 0
      0.18, f0_scores, tmp_f0_contour2);
#else
      allowed_range, f0_scores, tmp_f0_contour2);
#endif
  FixStep4(tmp_f0_contour2, f0_length, 9, best_f0_contour);

  delete[] tmp_f0_contour1;
  delete[] tmp_f0_contour2;
}